

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void convertToWithoutRowidTable(Parse *pParse,Table *pTab)

{
  u16 uVar1;
  short sVar2;
  sqlite3 *db;
  Vdbe *pVVar3;
  ExprList_item *pEVar4;
  Column *pCVar5;
  i16 *piVar6;
  ExprList *pList;
  char *pcVar7;
  Index *pIdx;
  byte bVar8;
  ushort uVar9;
  int iVar10;
  Op *pOVar11;
  long lVar12;
  short sVar13;
  ulong uVar14;
  uint uVar15;
  short *psVar16;
  short *psVar17;
  uint uVar18;
  Index *pIdx_00;
  uint uVar19;
  
  db = pParse->db;
  pVVar3 = pParse->pVdbe;
  iVar10 = pParse->addrCrTab;
  if (iVar10 != 0) {
    if (iVar10 < 0) {
      iVar10 = pVVar3->nOp + -1;
    }
    if (pVVar3->db->mallocFailed == '\0') {
      pOVar11 = pVVar3->aOp + iVar10;
    }
    else {
      pOVar11 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar11->opcode = 'x';
  }
  iVar10 = pParse->addrSkipPK;
  if (iVar10 != 0) {
    if (iVar10 < 0) {
      iVar10 = pVVar3->nOp + -1;
    }
    if (pVVar3->db->mallocFailed == '\0') {
      pOVar11 = pVVar3->aOp + iVar10;
    }
    else {
      pOVar11 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar11->opcode = '\x10';
  }
  if (pTab->iPKey < 0) {
    for (pIdx = pTab->pIndex; pIdx != (Index *)0x0; pIdx = pIdx->pNext) {
      if ((pIdx->field_0x5b & 3) == 2) goto LAB_001536fe;
    }
    pIdx = (Index *)0x0;
LAB_001536fe:
    uVar9 = pIdx->nKeyCol;
    uVar19 = 1;
    if (1 < uVar9) {
      psVar16 = pIdx->aiColumn;
      uVar19 = 1;
      uVar14 = 1;
      do {
        psVar17 = psVar16;
        uVar18 = uVar19;
        do {
          if ((int)uVar18 < 1) {
            lVar12 = (long)(int)uVar19;
            uVar19 = uVar19 + 1;
            psVar16[lVar12] = psVar16[uVar14];
            uVar9 = pIdx->nKeyCol;
            goto LAB_0015374f;
          }
          uVar18 = uVar18 - 1;
          sVar13 = *psVar17;
          psVar17 = psVar17 + 1;
        } while (sVar13 != psVar16[uVar14]);
        pIdx->nColumn = pIdx->nColumn - 1;
LAB_0015374f:
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar9);
    }
    pIdx->nKeyCol = (u16)uVar19;
  }
  else {
    pList = sqlite3ExprListAppend((Parse *)db,(ExprList *)0x0,(Expr *)0x0);
    if (pList == (ExprList *)0x0) {
      return;
    }
    pcVar7 = sqlite3DbStrDup(pParse->db,pTab->aCol[pTab->iPKey].zName);
    pEVar4 = pList->a;
    pEVar4->zName = pcVar7;
    pEVar4->sortOrder = pParse->iPkSortOrder;
    pIdx = sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,
                              (uint)pTab->keyConf,(Token *)0x0,(Expr *)0x0,0,0);
    if (pIdx == (Index *)0x0) {
      return;
    }
    pIdx->field_0x5b = pIdx->field_0x5b & 0xfc | 2;
    pTab->iPKey = -1;
    uVar19 = (uint)pIdx->nKeyCol;
  }
  bVar8 = pIdx->field_0x5b | 0x20;
  pIdx->field_0x5b = bVar8;
  uVar19 = uVar19 & 0xffff;
  if ((db->init).imposterTable == '\0') {
    if (uVar19 != 0) {
      pCVar5 = pTab->aCol;
      piVar6 = pIdx->aiColumn;
      uVar14 = 0;
      do {
        pCVar5[piVar6[uVar14]].notNull = '\x01';
        uVar14 = uVar14 + 1;
      } while (uVar19 != uVar14);
      bVar8 = pIdx->field_0x5b;
    }
    pIdx->field_0x5b = bVar8 | 8;
  }
  pIdx->tnum = pTab->tnum;
  pIdx_00 = pTab->pIndex;
  if (pIdx_00 != (Index *)0x0) {
    do {
      if ((pIdx_00->field_0x5b & 3) != 2) {
        if (uVar19 != 0) {
          uVar14 = 0;
          iVar10 = 0;
          do {
            uVar18 = (uint)pIdx_00->nKeyCol;
            psVar16 = pIdx_00->aiColumn;
            do {
              if ((int)uVar18 < 1) {
                iVar10 = iVar10 + 1;
                break;
              }
              uVar18 = uVar18 - 1;
              sVar13 = *psVar16;
              psVar16 = psVar16 + 1;
            } while (sVar13 != pIdx->aiColumn[uVar14]);
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar19);
          if (iVar10 != 0) {
            iVar10 = resizeIndexObject(db,pIdx_00,iVar10 + (uint)pIdx_00->nKeyCol);
            if (iVar10 != 0) {
              return;
            }
            if (uVar19 != 0) {
              uVar18 = (uint)pIdx_00->nKeyCol;
              uVar14 = 0;
              do {
                uVar15 = (uint)pIdx_00->nKeyCol;
                psVar16 = pIdx_00->aiColumn;
                do {
                  if ((int)uVar15 < 1) {
                    pIdx_00->aiColumn[(int)uVar18] = pIdx->aiColumn[uVar14];
                    pIdx_00->azColl[(int)uVar18] = pIdx->azColl[uVar14];
                    uVar18 = uVar18 + 1;
                    break;
                  }
                  uVar15 = uVar15 - 1;
                  sVar13 = *psVar16;
                  psVar16 = psVar16 + 1;
                } while (sVar13 != pIdx->aiColumn[uVar14]);
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar19);
            }
            goto LAB_001538a3;
          }
        }
        pIdx_00->nColumn = pIdx_00->nKeyCol;
      }
LAB_001538a3:
      pIdx_00 = pIdx_00->pNext;
    } while (pIdx_00 != (Index *)0x0);
  }
  uVar1 = pTab->nCol;
  if ((int)uVar19 < (int)(short)uVar1) {
    iVar10 = resizeIndexObject(db,pIdx,(int)(short)uVar1);
    if ((iVar10 == 0) && (sVar13 = pTab->nCol, 0 < sVar13)) {
      iVar10 = 0;
      do {
        psVar16 = pIdx->aiColumn;
        uVar18 = uVar19;
        do {
          if ((int)uVar18 < 1) {
            pIdx->aiColumn[(int)uVar19] = (short)iVar10;
            pIdx->azColl[(int)uVar19] = "BINARY";
            uVar19 = uVar19 + 1;
            sVar13 = pTab->nCol;
            break;
          }
          uVar18 = uVar18 - 1;
          sVar2 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (iVar10 != sVar2);
        iVar10 = iVar10 + 1;
      } while (iVar10 < sVar13);
    }
  }
  else {
    pIdx->nColumn = uVar1;
  }
  return;
}

Assistant:

static void convertToWithoutRowidTable(Parse *pParse, Table *pTab){
  Index *pIdx;
  Index *pPk;
  int nPk;
  int i, j;
  sqlite3 *db = pParse->db;
  Vdbe *v = pParse->pVdbe;

  /* Convert the OP_CreateTable opcode that would normally create the
  ** root-page for the table into an OP_CreateIndex opcode.  The index
  ** created will become the PRIMARY KEY index.
  */
  if( pParse->addrCrTab ){
    assert( v );
    sqlite3VdbeGetOp(v, pParse->addrCrTab)->opcode = OP_CreateIndex;
  }

  /* Bypass the creation of the PRIMARY KEY btree and the sqlite_master
  ** table entry.
  */
  if( pParse->addrSkipPK ){
    assert( v );
    sqlite3VdbeGetOp(v, pParse->addrSkipPK)->opcode = OP_Goto;
  }

  /* Locate the PRIMARY KEY index.  Or, if this table was originally
  ** an INTEGER PRIMARY KEY table, create a new PRIMARY KEY index. 
  */
  if( pTab->iPKey>=0 ){
    ExprList *pList;
    pList = sqlite3ExprListAppend(pParse, 0, 0);
    if( pList==0 ) return;
    pList->a[0].zName = sqlite3DbStrDup(pParse->db,
                                        pTab->aCol[pTab->iPKey].zName);
    pList->a[0].sortOrder = pParse->iPkSortOrder;
    assert( pParse->pNewTable==pTab );
    pPk = sqlite3CreateIndex(pParse, 0, 0, 0, pList, pTab->keyConf, 0, 0, 0, 0);
    if( pPk==0 ) return;
    pPk->idxType = SQLITE_IDXTYPE_PRIMARYKEY;
    pTab->iPKey = -1;
  }else{
    pPk = sqlite3PrimaryKeyIndex(pTab);
    /*
    ** Remove all redundant columns from the PRIMARY KEY.  For example, change
    ** "PRIMARY KEY(a,b,a,b,c,b,c,d)" into just "PRIMARY KEY(a,b,c,d)".  Later
    ** code assumes the PRIMARY KEY contains no repeated columns.
    */
    for(i=j=1; i<pPk->nKeyCol; i++){
      if( hasColumn(pPk->aiColumn, j, pPk->aiColumn[i]) ){
        pPk->nColumn--;
      }else{
        pPk->aiColumn[j++] = pPk->aiColumn[i];
      }
    }
    pPk->nKeyCol = j;
  }
  pPk->isCovering = 1;
  assert( pPk!=0 );
  nPk = pPk->nKeyCol;

  /* Make sure every column of the PRIMARY KEY is NOT NULL.  (Except,
  ** do not enforce this for imposter tables.) */
  if( !db->init.imposterTable ){
    for(i=0; i<nPk; i++){
      pTab->aCol[pPk->aiColumn[i]].notNull = 1;
    }
    pPk->uniqNotNull = 1;
  }

  /* The root page of the PRIMARY KEY is the table root page */
  pPk->tnum = pTab->tnum;

  /* Update the in-memory representation of all UNIQUE indices by converting
  ** the final rowid column into one or more columns of the PRIMARY KEY.
  */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int n;
    if( IsPrimaryKeyIndex(pIdx) ) continue;
    for(i=n=0; i<nPk; i++){
      if( !hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) ) n++;
    }
    if( n==0 ){
      /* This index is a superset of the primary key */
      pIdx->nColumn = pIdx->nKeyCol;
      continue;
    }
    if( resizeIndexObject(db, pIdx, pIdx->nKeyCol+n) ) return;
    for(i=0, j=pIdx->nKeyCol; i<nPk; i++){
      if( !hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) ){
        pIdx->aiColumn[j] = pPk->aiColumn[i];
        pIdx->azColl[j] = pPk->azColl[i];
        j++;
      }
    }
    assert( pIdx->nColumn>=pIdx->nKeyCol+n );
    assert( pIdx->nColumn>=j );
  }

  /* Add all table columns to the PRIMARY KEY index
  */
  if( nPk<pTab->nCol ){
    if( resizeIndexObject(db, pPk, pTab->nCol) ) return;
    for(i=0, j=nPk; i<pTab->nCol; i++){
      if( !hasColumn(pPk->aiColumn, j, i) ){
        assert( j<pPk->nColumn );
        pPk->aiColumn[j] = i;
        pPk->azColl[j] = "BINARY";
        j++;
      }
    }
    assert( pPk->nColumn==j );
    assert( pTab->nCol==j );
  }else{
    pPk->nColumn = pTab->nCol;
  }
}